

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void __thiscall ghc::filesystem::path::append_name(path *this,value_type *name)

{
  ulong uVar1;
  char *pcVar2;
  path local_38;
  value_type *local_18;
  value_type *name_local;
  path *this_local;
  
  local_18 = name;
  name_local = (value_type *)this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::back();
    if (*pcVar2 != '/') {
      std::__cxx11::string::push_back((char)this);
    }
    std::__cxx11::string::operator+=((string *)this,local_18);
    check_long_path(this);
  }
  else {
    path<char_const*,ghc::filesystem::path>(&local_38,&local_18,auto_format);
    operator/=(this,&local_38);
    ~path(&local_38);
  }
  return;
}

Assistant:

GHC_INLINE void path::append_name(const value_type* name)
{
    if (_path.empty()) {
        this->operator/=(path(name));
    }
    else {
        if (_path.back() != path::preferred_separator) {
            _path.push_back(path::preferred_separator);
        }
        _path += name;
        check_long_path();
    }
}